

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

void __thiscall QUrl::setAuthority(QUrl *this,QString *authority,ParsingMode mode)

{
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  detach(this);
  QUrlPrivate::clearError(this->d);
  if (mode == DecodedMode) {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning
              (&local_40,"QUrl::setAuthority(): QUrl::DecodedMode is not permitted in this function"
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QUrlPrivate::setAuthority(this->d,authority,0,(authority->d).size,mode);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrl::setAuthority(const QString &authority, ParsingMode mode)
{
    detach();
    d->clearError();

    if (mode == DecodedMode) {
        qWarning("QUrl::setAuthority(): QUrl::DecodedMode is not permitted in this function");
        return;
    }

    d->setAuthority(authority, 0, authority.size(), mode);
}